

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

string * __thiscall
lest::to_string<int,nonstd::expected_lite::expected<int,char>>
          (string *__return_storage_ptr__,lest *this,int *lhs,string *op,expected<int,_char> *rhs)

{
  ostream *poVar1;
  int value;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  ForNonContainerNonPointer<nonstd::expected_lite::expected<int,_char>,_std::string> local_1f0;
  string local_1c0;
  ostringstream local_1a0 [8];
  ostringstream os;
  expected<int,_char> *rhs_local;
  string *op_local;
  int *lhs_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  to_string_abi_cxx11_(&local_1c0,(lest *)(ulong)*(uint *)this,value);
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  to_string<nonstd::expected_lite::expected<int,char>>
            (&local_1f0,(lest *)op,(expected<int,_char> *)CONCAT44(extraout_var,extraout_EDX));
  std::operator<<(poVar1,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}